

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_io.c
# Opt level: O2

int IDASetEtaLow(void *ida_mem,sunrealtype eta_low)

{
  int iVar1;
  
  if (ida_mem == (void *)0x0) {
    iVar1 = -0x14;
    IDAProcessError((IDAMem)0x0,-0x14,0x98,"IDASetEtaLow",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                    ,"ida_mem = NULL illegal.");
  }
  else {
    if ((eta_low <= 0.0) || (1.0 <= eta_low)) {
      *(undefined8 *)((long)ida_mem + 0x5a0) = 0x3feccccccccccccd;
    }
    else {
      *(sunrealtype *)((long)ida_mem + 0x5a0) = eta_low;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int IDASetEtaLow(void* ida_mem, sunrealtype eta_low)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* set allowed value or use default */
  if (eta_low <= ZERO || eta_low >= ONE)
  {
    IDA_mem->ida_eta_low = ETA_LOW_DEFAULT;
  }
  else { IDA_mem->ida_eta_low = eta_low; }

  return (IDA_SUCCESS);
}